

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

void __thiscall
el::base::Writer::initializeLogger(Writer *this,string *loggerId,bool lookup,bool needLock)

{
  RegisteredLoggers *pRVar1;
  bool bVar2;
  Logger *pLVar3;
  Writer *pWVar4;
  undefined7 in_register_00000011;
  Level level;
  allocator local_a1;
  undefined1 local_a0 [32];
  LineNumber LStack_80;
  char *local_78;
  VerboseLevel local_70;
  Logger *local_68;
  bool local_60;
  Logger *local_58;
  char *local_50;
  DispatchAction local_48;
  pointer local_40;
  pointer pbStack_38;
  pointer local_30;
  
  if ((int)CONCAT71(in_register_00000011,lookup) == 0) {
    pLVar3 = this->m_logger;
  }
  else {
    pLVar3 = RegisteredLoggers::get
                       (*(RegisteredLoggers **)(elStorage + 0x10),loggerId,
                        (bool)((byte)(*(uint *)(elStorage + 0x18) >> 0xc) & 1));
    this->m_logger = pLVar3;
  }
  if (pLVar3 == (Logger *)0x0) {
    pRVar1 = *(RegisteredLoggers **)(elStorage + 0x10);
    std::__cxx11::string::string((string *)local_a0,"default",&local_a1);
    bVar2 = RegisteredLoggers::has(pRVar1,(string *)local_a0);
    std::__cxx11::string::~string((string *)local_a0);
    if (!bVar2) {
      pRVar1 = *(RegisteredLoggers **)(elStorage + 0x10);
      std::__cxx11::string::string((string *)local_a0,"default",&local_a1);
      RegisteredLoggers::get(pRVar1,(string *)local_a0,true);
      std::__cxx11::string::~string((string *)local_a0);
    }
    local_a0._24_8_ = this->m_file;
    LStack_80 = this->m_line;
    local_78 = this->m_func;
    local_a0._0_8_ = &PTR__Writer_0012ce20;
    local_a0._8_8_ = (LogMessage *)0x0;
    local_a0._16_4_ = 4;
    local_70 = 0;
    local_68 = (Logger *)0x0;
    local_60 = false;
    local_58 = (Logger *)0x0;
    local_50 = "";
    local_48 = NormalLog;
    local_40 = (pointer)0x0;
    pbStack_38 = (pointer)0x0;
    local_30 = (pointer)0x0;
    construct((Writer *)local_a0,1,"default");
    pWVar4 = operator<<((Writer *)local_a0,(char (*) [9])"Logger [");
    pWVar4 = operator<<(pWVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               loggerId);
    operator<<(pWVar4,(char (*) [25])"] is not registered yet!");
    ~Writer((Writer *)local_a0);
    this->m_proceed = false;
    return;
  }
  if (needLock) {
    (**(pLVar3->super_ThreadSafe)._vptr_ThreadSafe)(pLVar3);
  }
  if ((*(byte *)(elStorage + 0x19) & 8) == 0) {
    pLVar3 = this->m_logger;
    level = this->m_level;
  }
  else {
    if (this->m_level != Verbose) {
      bVar2 = *(Level *)(elStorage + 0x174) <= this->m_level;
      goto LAB_00113624;
    }
    pLVar3 = this->m_logger;
    level = Verbose;
  }
  bVar2 = Logger::enabled(pLVar3,level);
LAB_00113624:
  this->m_proceed = bVar2;
  return;
}

Assistant:

void Writer::initializeLogger(const std::string& loggerId, bool lookup, bool needLock) {
  if (lookup) {
    m_logger = ELPP->registeredLoggers()->get(loggerId, ELPP->hasFlag(LoggingFlag::CreateLoggerAutomatically));
  }
  if (m_logger == nullptr) {
    {
      if (!ELPP->registeredLoggers()->has(std::string(base::consts::kDefaultLoggerId))) {
        // Somehow default logger has been unregistered. Not good! Register again
        ELPP->registeredLoggers()->get(std::string(base::consts::kDefaultLoggerId));
      }
    }
    Writer(Level::Debug, m_file, m_line, m_func).construct(1, base::consts::kDefaultLoggerId)
        << "Logger [" << loggerId << "] is not registered yet!";
    m_proceed = false;
  } else {
    if (needLock) {
      m_logger->acquireLock();  // This should not be unlocked by checking m_proceed because
      // m_proceed can be changed by lines below
    }
    if (ELPP->hasFlag(LoggingFlag::HierarchicalLogging)) {
      m_proceed = m_level == Level::Verbose ? m_logger->enabled(m_level) :
                  LevelHelper::castToInt(m_level) >= LevelHelper::castToInt(ELPP->m_loggingLevel);
    } else {
      m_proceed = m_logger->enabled(m_level);
    }
  }
}